

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void I422ToARGB1555Row_C(uint8 *src_y,uint8 *src_u,uint8 *src_v,uint8 *dst_argb1555,
                        YuvConstants *yuvconstants,int width)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int br;
  int bg;
  int bb;
  
  if (1 < width) {
    sVar1 = yuvconstants->kUVBiasB[0];
    sVar2 = yuvconstants->kUVBiasG[0];
    sVar3 = yuvconstants->kUVBiasR[0];
    iVar4 = yuvconstants->kYToRgb[0] * 0x101;
    iVar15 = 0;
    do {
      uVar5 = (uint)*src_y * iVar4 >> 0x10;
      iVar11 = (int)sVar1 - (int)yuvconstants->kUVToB[0] * (uint)*src_u;
      uVar13 = (int)(iVar11 + uVar5) >> 6;
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      if (0xfe < (int)uVar13) {
        uVar13 = 0xff;
      }
      iVar8 = (int)sVar2 -
              ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
              (int)yuvconstants->kUVToG[0] * (uint)*src_u);
      iVar14 = iVar8 + uVar5;
      if (iVar14 >> 6 < 1) {
        iVar14 = 0;
      }
      uVar10 = iVar14 >> 6;
      if (0xfe < (int)uVar10) {
        uVar10 = 0xff;
      }
      iVar14 = (int)sVar3 - (int)yuvconstants->kUVToR[1] * (uint)*src_v;
      uVar5 = (int)(uVar5 + iVar14) >> 6;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      if (0xfe < (int)uVar5) {
        uVar5 = 0xff;
      }
      uVar6 = (uint)src_y[1] * iVar4 >> 0x10;
      uVar12 = (int)(iVar11 + uVar6) >> 6;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      if (0xfe < (int)uVar12) {
        uVar12 = 0xff;
      }
      iVar8 = iVar8 + uVar6;
      if (iVar8 >> 6 < 1) {
        iVar8 = 0;
      }
      uVar9 = iVar8 >> 6;
      if (0xfe < (int)uVar9) {
        uVar9 = 0xff;
      }
      uVar6 = (int)(uVar6 + iVar14) >> 6;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      if (0xfe < (int)uVar6) {
        uVar6 = 0xff;
      }
      *(uint *)dst_argb1555 =
           (uVar13 >> 3) + (uVar10 & 0xf8) * 4 | (uVar12 & 0xf8) << 0xd | (uVar5 & 0xf8) << 7 |
           (uVar6 & 0xf8) << 0x17 | (uVar9 & 0xf8) << 0x12 | 0x80008000;
      src_y = src_y + 2;
      src_u = src_u + 1;
      src_v = src_v + 1;
      dst_argb1555 = (uint8 *)((long)dst_argb1555 + 4);
      iVar15 = iVar15 + 2;
    } while (iVar15 < width + -1);
  }
  if ((width & 1U) != 0) {
    uVar5 = (int)yuvconstants->kYToRgb[0] * (uint)*src_y * 0x101 >> 0x10;
    uVar13 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)*src_u) +
                  uVar5) >> 6;
    uVar10 = 0;
    if ((int)uVar13 < 1) {
      uVar13 = uVar10;
    }
    uVar7 = (ushort)uVar13;
    if (0xfe < (int)uVar13) {
      uVar7 = 0xff;
    }
    uVar13 = (int)(((int)yuvconstants->kUVBiasG[0] -
                   ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
                   (int)yuvconstants->kUVToG[0] * (uint)*src_u)) + uVar5) >> 6;
    if ((int)uVar13 < 1) {
      uVar13 = uVar10;
    }
    if (0xfe < (int)uVar13) {
      uVar13 = 0xff;
    }
    uVar5 = (int)(((int)yuvconstants->kUVBiasR[0] - (int)yuvconstants->kUVToR[1] * (uint)*src_v) +
                 uVar5) >> 6;
    if ((int)uVar5 < 1) {
      uVar5 = uVar10;
    }
    if (0xfe < (int)uVar5) {
      uVar5 = 0xff;
    }
    *(ushort *)dst_argb1555 =
         (ushort)((uVar5 & 0xf8) << 7) | (ushort)((uVar13 & 0xf8) << 2) | uVar7 >> 3 | 0x8000;
  }
  return;
}

Assistant:

void I422ToARGB1555Row_C(const uint8* src_y,
                         const uint8* src_u,
                         const uint8* src_v,
                         uint8* dst_argb1555,
                         const struct YuvConstants* yuvconstants,
                         int width) {
  uint8 b0;
  uint8 g0;
  uint8 r0;
  uint8 b1;
  uint8 g1;
  uint8 r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 3;
    r0 = r0 >> 3;
    b1 = b1 >> 3;
    g1 = g1 >> 3;
    r1 = r1 >> 3;
    *(uint32*)(dst_argb1555) = b0 | (g0 << 5) | (r0 << 10) | (b1 << 16) |
                               (g1 << 21) | (r1 << 26) | 0x80008000;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    dst_argb1555 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 3;
    r0 = r0 >> 3;
    *(uint16*)(dst_argb1555) = b0 | (g0 << 5) | (r0 << 10) | 0x8000;
  }
}